

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivySeq.c
# Opt level: O3

void Ivy_CutCompactAll(Ivy_Store_t *pCutStore)

{
  Ivy_Cut_t *pIVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int *piVar4;
  short sVar5;
  short sVar6;
  short *psVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  
  pCutStore->nCutsM = 0;
  iVar10 = pCutStore->nCuts;
  if (iVar10 < 1) {
    iVar9 = 0;
  }
  else {
    psVar7 = &pCutStore->pCuts[0].nSizeMax;
    lVar8 = 0;
    iVar9 = 0;
    do {
      if (psVar7[-1] != 0) {
        if (psVar7[-1] < *psVar7) {
          pCutStore->nCutsM = pCutStore->nCutsM + 1;
        }
        pIVar1 = (Ivy_Cut_t *)(psVar7 + -3);
        pCutStore->pCuts[iVar9].uHash = *(uint *)(psVar7 + 0xd);
        iVar10 = pIVar1->nLatches;
        sVar5 = pIVar1->nSize;
        sVar6 = pIVar1->nSizeMax;
        uVar2 = *(undefined8 *)(psVar7 + 1);
        uVar3 = *(undefined8 *)(psVar7 + 9);
        piVar4 = pCutStore->pCuts[iVar9].pArray;
        *(undefined8 *)(piVar4 + 2) = *(undefined8 *)(psVar7 + 5);
        *(undefined8 *)(piVar4 + 4) = uVar3;
        pIVar1 = pCutStore->pCuts + iVar9;
        pIVar1->nLatches = iVar10;
        pIVar1->nSize = sVar5;
        pIVar1->nSizeMax = sVar6;
        *(undefined8 *)pIVar1->pArray = uVar2;
        iVar10 = pCutStore->nCuts;
        iVar9 = iVar9 + 1;
      }
      lVar8 = lVar8 + 1;
      psVar7 = psVar7 + 0x12;
    } while (lVar8 < iVar10);
  }
  pCutStore->nCuts = iVar9;
  return;
}

Assistant:

void Ivy_CutCompactAll( Ivy_Store_t * pCutStore )
{
    Ivy_Cut_t * pCut;
    int i, k;
    pCutStore->nCutsM = 0;
    for ( i = k = 0; i < pCutStore->nCuts; i++ )
    {
        pCut = pCutStore->pCuts + i;
        if ( pCut->nSize == 0 )
            continue;
        if ( pCut->nSize < pCut->nSizeMax )
            pCutStore->nCutsM++;
        pCutStore->pCuts[k++] = *pCut;
    }
    pCutStore->nCuts = k;
}